

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

void __thiscall
spv::Builder::createMemoryBarrier(Builder *this,uint executionScope,uint memorySemantics)

{
  Block *this_00;
  Id IVar1;
  Instruction *pIVar2;
  undefined4 in_register_00000034;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_38 [3];
  Instruction *local_20;
  Instruction *op;
  uint memorySemantics_local;
  uint executionScope_local;
  Builder *this_local;
  
  op._0_4_ = memorySemantics;
  op._4_4_ = executionScope;
  _memorySemantics_local = this;
  pIVar2 = (Instruction *)
           Instruction::operator_new
                     ((Instruction *)0x38,CONCAT44(in_register_00000034,executionScope));
  Instruction::Instruction(pIVar2,OpMemoryBarrier);
  local_20 = pIVar2;
  IVar1 = makeUintConstant(this,op._4_4_,false);
  Instruction::addImmediateOperand(pIVar2,IVar1);
  pIVar2 = local_20;
  IVar1 = makeUintConstant(this,(uint)op,false);
  Instruction::addImmediateOperand(pIVar2,IVar1);
  this_00 = this->buildPoint;
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)local_38,local_20
            );
  Block::addInstruction(this_00,local_38);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(local_38);
  return;
}

Assistant:

void Builder::createMemoryBarrier(unsigned executionScope, unsigned memorySemantics)
{
    Instruction* op = new Instruction(OpMemoryBarrier);
    op->addImmediateOperand(makeUintConstant(executionScope));
    op->addImmediateOperand(makeUintConstant(memorySemantics));
    buildPoint->addInstruction(std::unique_ptr<Instruction>(op));
}